

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

UResourceDataEntry * getPoolEntry(char *path,UErrorCode *status)

{
  UResourceDataEntry *pUVar1;
  
  pUVar1 = init_entry("pool",path,status);
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (((pUVar1 == (UResourceDataEntry *)0x0 || (pUVar1->fBogus != U_ZERO_ERROR)) ||
      ((pUVar1->fData).isPoolBundle == '\0')))) {
    *status = U_INVALID_FORMAT_ERROR;
  }
  return pUVar1;
}

Assistant:

static UResourceDataEntry *
getPoolEntry(const char *path, UErrorCode *status) {
    UResourceDataEntry *poolBundle = init_entry(kPoolBundleName, path, status);
    if( U_SUCCESS(*status) &&
        (poolBundle == NULL || poolBundle->fBogus != U_ZERO_ERROR || !poolBundle->fData.isPoolBundle)
    ) {
        *status = U_INVALID_FORMAT_ERROR;
    }
    return poolBundle;
}